

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

void pztopology::TPZPrism::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  bool bVar1;
  double *pdVar2;
  ostream *this;
  long *in_RCX;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  double dVar3;
  double dVar4;
  double dVar5;
  TPZFMatrix<double> *this_00;
  double dVar6;
  double den_3;
  double den_2;
  double den_1;
  double den;
  double zeta;
  double eta;
  double qsi;
  double zero;
  size_t in_stack_00000288;
  char *in_stack_00000290;
  TPZVec<double> *in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  TPZFMatrix<double> *in_stack_fffffffffffffe90;
  TPZVec<double> *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffea0;
  
  GetTolerance();
  pdVar2 = TPZVec<double>::operator[](in_RSI,0);
  dVar6 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RSI,1);
  dVar4 = *pdVar2;
  pdVar2 = TPZVec<double>::operator[](in_RSI,2);
  dVar3 = *pdVar2;
  bVar1 = CheckProjectionForSingularity<double>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  if (!bVar1) {
    this = std::operator<<((ostream *)&std::cout,
                           "Side projection is not regular and it should have been checked earlier. Aborting.."
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000290,in_stack_00000288);
  }
  switch(in_EDI) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,0);
    (**(code **)(*in_RCX + 0x68))(in_RCX,0);
    break;
  case 6:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    dVar4 = dVar4 + -1.0;
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = -1.0 - (dVar6 * 2.0) / dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = -2.0 / dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / (dVar4 * dVar4);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 7:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    dVar3 = dVar4 + dVar6;
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = (dVar4 * 2.0) / dVar3 + -1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar4 * -2.0) / (dVar3 * dVar3);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / (dVar3 * dVar3);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 8:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    dVar6 = dVar6 + -1.0;
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = (dVar4 * 2.0) / dVar6 + 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar4 * -2.0) / (dVar6 * dVar6);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 2.0 / dVar6;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 9:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    break;
  case 10:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    break;
  case 0xb:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    break;
  case 0xc:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    dVar4 = 1.0 - dVar4;
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = (dVar6 * 2.0) / dVar4 + -1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 2.0 / dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / (dVar4 * dVar4);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 0xd:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = (dVar4 * 2.0) / (dVar4 + dVar6) + -1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar4 * -2.0) / ((dVar4 + dVar6) * (dVar4 + dVar6));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / ((dVar4 + dVar6) * (dVar4 + dVar6));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 0xe:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,1);
    (**(code **)(*in_RCX + 0x68))(in_RCX,1,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = (dVar4 * 2.0) / (dVar6 + -1.0) + 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar4 * -2.0) / ((dVar6 + -1.0) * (dVar6 + -1.0));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 2.0 / (dVar6 + -1.0);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 0xf:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,2);
    (**(code **)(*in_RCX + 0x68))(in_RCX,2,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar6;
    pdVar2 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar2 = dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 0x10:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,2);
    (**(code **)(*in_RCX + 0x68))(in_RCX,2,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = -1.0 - (dVar6 * 2.0) / (dVar4 + -1.0);
    pdVar2 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar2 = dVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = -2.0 / (dVar4 + -1.0);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / ((dVar4 + -1.0) * (dVar4 + -1.0));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    break;
  case 0x11:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,2);
    (**(code **)(*in_RCX + 0x68))(in_RCX,2,3);
    dVar5 = (dVar4 * 2.0) / (dVar4 + dVar6) + -1.0;
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar5;
    pdVar2 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar2 = dVar3;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar4 * -2.0) / ((dVar4 + dVar6) * (dVar4 + dVar6));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = (dVar6 * 2.0) / ((dVar4 + dVar6) * (dVar4 + dVar6));
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    break;
  case 0x12:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,2);
    (**(code **)(*in_RCX + 0x68))(in_RCX,2,3);
    dVar5 = -1.0 - (dVar4 * 2.0) / (dVar6 + -1.0);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar5;
    pdVar2 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar2 = dVar3;
    this_00 = (TPZFMatrix<double> *)((dVar4 * 2.0) / ((dVar6 + -1.0) * (dVar6 + -1.0)));
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = (double)this_00;
    dVar6 = -2.0 / (dVar6 + -1.0);
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = dVar6;
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)dVar3,(int64_t)dVar5);
    *pdVar2 = 1.0;
    break;
  case 0x13:
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,2);
    (**(code **)(*in_RCX + 0x68))(in_RCX,2,3);
    pdVar2 = TPZVec<double>::operator[](in_RDX,0);
    *pdVar2 = dVar6;
    pdVar2 = TPZVec<double>::operator[](in_RDX,1);
    *pdVar2 = dVar4;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 1.0;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (int64_t)in_stack_fffffffffffffe80);
    *pdVar2 = 0.0;
    break;
  case 0x14:
    TPZVec<double>::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    (**(code **)(*in_RCX + 0x68))(in_RCX,3);
    (**(code **)(*in_RCX + 0x148))();
  }
  if (0x14 < in_EDI) {
    std::operator<<((ostream *)&std::cout,
                    "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "This should have been caught earlier in the execution, there is something wrong.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n");
    pzinternal::DebugStopImpl(in_stack_00000290,in_stack_00000288);
  }
  return;
}

Assistant:

void TPZPrism::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
        double zero = pztopology::GetTolerance();

        T qsi = InternalPar[0];
        T eta = InternalPar[1];
        T zeta = InternalPar[2];

        if(!CheckProjectionForSingularity(side,InternalPar)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
        }
        switch(side)
        {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            {
                SidePar.Resize(0); JacToSide.Resize(0,0);
                break;
            }
            case 6://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + eta;
                    SidePar[0] = -1 - (2*qsi)/den;
                    JacToSide(0,0) = -2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 7://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = eta + qsi;
                    SidePar[0] = -1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 8://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = -1 + qsi;
                    SidePar[0] = 1 + (2*eta)/den;
                    JacToSide(0,0) = (-2*eta)/(den*den);
                    JacToSide(0,1) = 2/den;
                    JacToSide(0,2) = 0;
                }
                break;

            case 9://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 10://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 11://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                SidePar[0] = zeta;
                JacToSide(0,0) = 0;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 1;
                break;

            case 12://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    T den = 1 - eta;
                    SidePar[0] = -1 +(2*qsi)/den;
                    JacToSide(0,0) = 2/den;
                    JacToSide(0,1) = (2*qsi)/(den*den);
                    JacToSide(0,2) = 0;
                }
                break;

            case 13://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                }
                break;

            case 14://1D
                SidePar.Resize(1); JacToSide.Resize(1,3);
                {
                    SidePar[0] = 1 + (2*eta)/(-1 + qsi);
                    JacToSide(0,0) = (-2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = 2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                }
                break;

            case 15://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;

            case 16://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*qsi)/(-1 + eta);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = -2/(-1 + eta);
                    JacToSide(0,1) = (2*qsi)/((-1 + eta)*(-1 + eta));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 17://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 + (2*eta)/(eta + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (-2*eta)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,1) = (2*qsi)/((eta + qsi)*(eta + qsi));
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 18://2D - quadrilateral
                SidePar.Resize(2); JacToSide.Resize(2,3);
                {
                    SidePar[0] = -1 - (2*eta)/(-1 + qsi);
                    SidePar[1] = zeta;
                    JacToSide(0,0) = (2*eta)/((-1 + qsi)*(-1 + qsi));
                    JacToSide(0,1) = -2/(-1 + qsi);
                    JacToSide(0,2) = 0;
                    JacToSide(1,0) = 0;
                    JacToSide(1,1) = 0;
                    JacToSide(1,2) = 1;
                }
                break;

            case 19://2D - triangle
                SidePar.Resize(2); JacToSide.Resize(2,3);
                SidePar[0] = qsi;
                SidePar[1] = eta;
                JacToSide(0,0) = 1;
                JacToSide(0,1) = 0;
                JacToSide(0,2) = 0;
                JacToSide(1,0) = 0;
                JacToSide(1,1) = 1;
                JacToSide(1,2) = 0;
                break;
            case 20:
                SidePar = InternalPar;
                JacToSide.Resize(3, 3);
                JacToSide.Identity();
                break;
        }
        if(side > 20)
        {
            cout << "Cant compute MapToSide method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n";
            cout << "This should have been caught earlier in the execution, there is something wrong.\n";
            cout << "Check method TPZTetrahedron::CheckProjectionForSingularity<T>\n";
            DebugStop();
        }
    }